

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::StoreLPObservation::operator()
          (StoreLPObservation *this,iterator_t *str,iterator_t *end)

{
  undefined8 uVar1;
  long *in_RDI;
  stringstream ermsg;
  E e;
  Index aI;
  Index curAgIndex;
  string *in_stack_fffffffffffffda8;
  MultiAgentDecisionProcessDiscrete *in_stack_fffffffffffffdb0;
  value_type_conflict1 *in_stack_fffffffffffffdb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd8;
  E *in_stack_fffffffffffffde0;
  
  if (*(int *)(*in_RDI + 0x40) == 2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  else if (*(int *)(*in_RDI + 0x40) == 3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0xb8));
    GetPOMDPDiscrete((ParserPOMDPFormat_Spirit *)*in_RDI);
    MultiAgentDecisionProcessDiscrete::GetObservationIndexByName
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  else {
    if (*(int *)(*in_RDI + 0x40) != 4) {
      uVar1 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      __cxa_throw(uVar1,&E::typeinfo,E::~E);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {

                if(DEBUG_POMDP_PARSE)
                    std::cout << "StoreLPObservation: pushing "<<std::string(str,end)<< 
                        " on _m_lp_JO"<<std::endl;
                if(_m_po->_m_lp_type == UINT)
                    _m_po->_m_lp_JO.push_back(_m_po->_m_lp_uint);
                else if(_m_po->_m_lp_type == STRING)
                {
                    //make sure that _m_lp_JO is cleared after each joint action
                    //so we can do this:
                    Index curAgIndex =  _m_po->_m_lp_JO.size();
                    try
                    {
                        Index aI = _m_po->GetPOMDPDiscrete()->GetObservationIndexByName(
                            _m_po->_m_lp_string, curAgIndex);
                        _m_po->_m_lp_JO.push_back(aI);
                    }
                    catch(E e)
                    {
                        std::stringstream ermsg; ermsg << e.SoftPrint() << " (at " << 
                            str.get_position() << ")"<<std::endl;
                        throw EParse(ermsg);
                    }
                }
                else if(_m_po->_m_lp_type == ASTERICK )
                    _m_po->_m_lp_JO.push_back(_m_po->_m_anyJOIndex);
                else
                    throw E("StoreLPObservation expected that the last parsed type is a action index(uint), action name (string) or wilcard ('*').");
            }